

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O2

VOID DebugBreak(void)

{
  uint uVar1;
  int iVar2;
  BOOL BVar3;
  __pid_t __pid;
  __pid_t _Var4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  char *__s;
  int *piVar8;
  long lVar9;
  ulong count;
  long in_FS_OFFSET;
  char *local_d8;
  char *argv [4];
  Volatile<int> spin;
  StackString<32UL,_char> local_a8;
  char local_68 [8];
  char pid_buf [45];
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  if (!PAL_InitializeChakraCoreCalled) goto LAB_00149ce2;
  pcVar5 = getenv("PAL_RUN_ON_DEBUG_BREAK");
  if (pcVar5 != (char *)0x0) {
    local_a8.m_buffer = local_a8.m_innerBuffer;
    local_a8.m_count = 0;
    if (exe_module.lib_name == (LPWSTR)0x0) {
      lVar9 = 10;
    }
    else {
      sVar6 = PAL_wcslen(exe_module.lib_name);
      lVar9 = (long)(int)sVar6;
    }
    sVar7 = strlen("PAL_EXE_NAME=");
    count = sVar7 + lVar9 + 1;
    __s = StackString<32UL,_char>::OpenStringBuffer(&local_a8,count);
    if (__s == (char *)0x0) {
LAB_00149c14:
      StackString<32UL,_char>::~StackString(&local_a8);
    }
    else {
      uVar1 = getpid();
      iVar2 = snprintf(local_68,0x2d,"PAL_EXE_PID=%d",(ulong)uVar1);
      if ((iVar2 < 1) ||
         (iVar2 = snprintf(__s,sVar7 + lVar9 + 2,"PAL_EXE_NAME=%ls",exe_module.lib_name), iVar2 < 1)
         ) goto LAB_00149c14;
      if (count < local_a8.m_count) {
        local_a8.m_count = count;
      }
      local_a8.m_buffer[local_a8.m_count] = '\0';
      BVar3 = MiscPutenv(local_68,0);
      if ((BVar3 == 0) || (BVar3 = MiscPutenv(__s,0), BVar3 == 0)) goto LAB_00149c14;
      argv[3]._4_4_ = 1;
      printf("Spawning command: %s\n",pcVar5);
      __pid = fork();
      if (__pid != -1) {
        if (__pid == 0) {
          local_d8 = "sh";
          argv[0] = "-c";
          argv[2] = (char *)0x0;
          argv[1] = pcVar5;
          execv("/bin/sh",&local_d8);
          exit(0x7f);
        }
        do {
          do {
            if (argv[3]._4_4_ == 0) {
LAB_00149c8b:
              StackString<32UL,_char>::~StackString(&local_a8);
              goto LAB_00149c55;
            }
            local_d8 = (char *)((ulong)local_d8 & 0xffffffff00000000);
            _Var4 = waitpid(__pid,(int *)&local_d8,1);
          } while (_Var4 == 0);
          if (_Var4 != -1) {
            if (((ulong)local_d8 & 0x7f) == 0) {
              if (((ulong)local_d8 & 0xff00) == 0) goto LAB_00149c8b;
            }
            else {
              fprintf(_stderr,"unexpected return from waitpid\n");
            }
            break;
          }
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
      }
      StackString<32UL,_char>::~StackString(&local_a8);
    }
    fprintf(_stderr,"Failed to execute command: \'%s\'\n",pcVar5);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    DBG_DebugBreak();
LAB_00149c55:
    if (PAL_InitializeChakraCoreCalled != false) {
      if (*(long *)(in_FS_OFFSET + 0x28) != stack0xffffffffffffffc8) {
        __stack_chk_fail();
      }
      return;
    }
  }
LAB_00149ce2:
  abort();
}

Assistant:

VOID
PALAPI
DebugBreak(
       VOID)
{
    PERF_ENTRY(DebugBreak);
    ENTRY("DebugBreak()\n");

    if (DebugBreakCommand() <= 0) {
        // either didn't do anything, or failed
        TRACE("Calling DBG_DebugBreak\n");
        DBG_DebugBreak();
    }

    LOGEXIT("DebugBreak returns\n");
    PERF_EXIT(DebugBreak);
}